

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentFactoredStates::StateIndexToFactorValueIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MADPComponentFactoredStates *this,Index s_e,Scope *sfSC)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_sf_e;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_38,
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_39);
  puVar1 = (sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar3 = (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    puVar2 = (this->_m_sfacDomainSizes).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = (ulong)(uint)puVar2[puVar1[uVar4]];
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < (ulong)(lVar3 >> 2));
  }
  IndexTools::JointToIndividualIndices(__return_storage_ptr__,s_e,&local_38);
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Index> MADPComponentFactoredStates::
StateIndexToFactorValueIndices(Index s_e, 
        const Scope& sfSC) const
{
    vector<size_t> nr_sf_e(sfSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        _m_sfacDomainSizes, sfSC, nr_sf_e);
    vector<Index> s_e_vec = IndexTools::JointToIndividualIndices(s_e, nr_sf_e);
    return(s_e_vec);
}